

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall
Tokenizer::simpleWithEqOrDouble
          (Tokenizer *this,char c,TokenType type,TokenType typeEq,TokenType typeDouble)

{
  char cVar1;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  long *plVar5;
  long *plVar6;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *p_Var7;
  undefined1 local_f9;
  Mark local_f8;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_f0;
  TokenType local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  byte local_c0;
  Mark local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_90 [2];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_80;
  long local_60 [2];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_50;
  long local_48;
  undefined8 local_40;
  
  pMVar4 = Stream::getMark(&this->stream_);
  local_f8 = *pMVar4;
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 != c) goto LAB_00164dd2;
  iVar3 = Stream::advance(&this->stream_);
  if (iVar3 == 0x3d) {
    local_90[0] = &local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,'\x01');
    plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
    local_b0 = &local_a0;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_a0 = *plVar6;
      uStack_98 = (undefined4)plVar5[3];
      uStack_94 = *(undefined4 *)((long)plVar5 + 0x1c);
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar5;
    }
    local_a8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_e0[0] = local_d0;
    local_e8 = typeEq;
    std::__cxx11::string::_M_construct<char*>((string *)local_e0,local_b0,local_a8 + (long)local_b0)
    ;
    local_c0 = 0;
    local_b8 = local_f8;
    (this->token_).type = local_e8;
    local_f0 = &(this->token_).value;
    std::operator=(&local_f0,(string *)local_e0,&local_f9);
    (this->token_).mark = local_b8;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_c0]._M_data)
              ((anon_class_1_0_00000001 *)&local_f0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_e0);
    local_c0 = 0xff;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    local_40 = local_80._M_rest;
    p_Var7 = local_90[0];
    if (local_90[0] != &local_80) {
LAB_00164dc2:
      operator_delete(p_Var7,local_40 + 1);
    }
  }
  else {
    cVar2 = Stream::peek(&this->stream_);
    if (cVar2 != c) {
      local_80._16_8_ = local_60;
      std::__cxx11::string::_M_construct((long)&local_80 + 0x10,'\x01');
      local_e0[0] = local_d0;
      local_e8 = type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,local_80._16_8_,local_80._24_8_ + local_80._16_8_);
      local_c0 = 0;
      local_b8 = local_f8;
      (this->token_).type = local_e8;
      local_90[0] = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&(this->token_).value;
      std::operator=(local_90,(string *)local_e0,&local_f0);
      (this->token_).mark = local_b8;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_c0]._M_data)
                ((anon_class_1_0_00000001 *)local_90,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_e0);
      local_c0 = 0xff;
      if ((long *)local_80._16_8_ != local_60) {
        operator_delete((void *)local_80._16_8_,local_60[0] + 1);
      }
      goto LAB_00164dd2;
    }
    local_50 = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)&stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct((ulong)&local_50,'\x02');
    local_e0[0] = local_d0;
    local_e8 = typeDouble;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,local_50,(local_50->_M_first)._M_storage._M_storage + local_48);
    local_c0 = 0;
    local_b8 = local_f8;
    (this->token_).type = local_e8;
    local_90[0] = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                   *)&(this->token_).value;
    std::operator=(local_90,(string *)local_e0,&local_f0);
    (this->token_).mark = local_b8;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_c0]._M_data)
              ((anon_class_1_0_00000001 *)local_90,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_e0);
    local_c0 = 0xff;
    p_Var7 = local_50;
    if (local_50 !=
        (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         *)&stack0xffffffffffffffc0) goto LAB_00164dc2;
  }
  Stream::advance(&this->stream_);
LAB_00164dd2:
  return cVar1 == c;
}

Assistant:

bool Tokenizer::simpleWithEqOrDouble(char c, TokenType type, TokenType typeEq, TokenType typeDouble)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == '=')
    {
      token_ = Token{typeEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else if(stream_.peek() == c)
    {
      token_ = Token{typeDouble, std::string(2, c), mark};
      stream_.advance();
    }
    else
      token_ = Token{type, std::string(1, c), mark};
  }
  else 
    return false;
  
  return true;
}